

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O1

int sparse_file_callback
              (sparse_file *s,bool sparse,bool crc,_func_int_void_ptr_void_ptr_size_t *write,
              void *priv)

{
  uint chunks;
  int iVar1;
  output_file *out;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  chunks = sparse_count_chunks(s);
  out = output_file_open_callback
                  (write,priv,s->block_size,s->len,0,(int)CONCAT71(in_register_00000031,sparse),
                   chunks,(int)CONCAT71(in_register_00000011,crc));
  if (out == (output_file *)0x0) {
    iVar1 = -0xc;
  }
  else {
    iVar1 = write_all_blocks(s,out);
    output_file_close(out);
  }
  return iVar1;
}

Assistant:

int sparse_file_callback(struct sparse_file* s, bool sparse, bool crc,
                         int (*write)(void* priv, const void* data, size_t len), void* priv) {
  int ret;
  int chunks;
  struct output_file* out;

  chunks = sparse_count_chunks(s);
  out = output_file_open_callback(write, priv, s->block_size, s->len, false, sparse, chunks, crc);

  if (!out) return -ENOMEM;

  ret = write_all_blocks(s, out);

  output_file_close(out);

  return ret;
}